

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

bool checktargetext(LinkedSection *ls,uint8_t id,uint8_t subid)

{
  Section *pSVar1;
  TargetExt *te;
  Section *nextsec;
  Section *sec;
  uint8_t subid_local;
  uint8_t id_local;
  LinkedSection *ls_local;
  
  sec = (Section *)(ls->sections).first;
  do {
    do {
      pSVar1 = (Section *)(sec->n).next;
      if (pSVar1 == (Section *)0x0) {
        return 0;
      }
      te = sec->special;
      sec = pSVar1;
    } while (te == (TargetExt *)0x0);
    do {
      if ((te->id == id) && ((te->sub_id == subid || (subid == '\0')))) {
        return 1;
      }
      te = te->next;
    } while (te != (TargetExt *)0x0);
  } while( true );
}

Assistant:

bool checktargetext(struct LinkedSection *ls,uint8_t id,uint8_t subid)
/* Checks if one of the sections in LinkedSection has a TargetExt */
/* block with the given id. If subid = 0 it will be ignored. */
{
  struct Section *sec = (struct Section *)ls->sections.first;
  struct Section *nextsec;
  struct TargetExt *te;

  while (nextsec = (struct Section *)sec->n.next) {
    if (te = sec->special) {
      do {
        if (te->id==id && (te->sub_id==subid || subid==0))
          return TRUE;
      }
      while (te = te->next);
    }
    sec = nextsec;
  }
  return FALSE;
}